

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_update_all_pages_cache(qpdf_data qpdf)

{
  qpdf_data qpdf_00;
  QPDF_ERROR_CODE QVar1;
  anon_class_1_0_00000001 local_31;
  function<void_(_qpdf_data_*)> local_30;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  local_10 = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_update_all_pages_cache",0);
  qpdf_00 = local_10;
  std::function<void(_qpdf_data*)>::function<qpdf_update_all_pages_cache::__0,void>
            ((function<void(_qpdf_data*)> *)&local_30,&local_31);
  QVar1 = trap_errors(qpdf_00,&local_30);
  std::function<void_(_qpdf_data_*)>::~function(&local_30);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_update_all_pages_cache(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_update_all_pages_cache");
    return trap_errors(qpdf, [](qpdf_data q) { q->qpdf->updateAllPagesCache(); });
}